

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotErrorBars<unsigned_long_long>
               (char *label_id,unsigned_long_long *xs,unsigned_long_long *ys,unsigned_long_long *err
               ,int count,int offset,int stride)

{
  undefined1 local_60 [8];
  GetterError<unsigned_long_long> getter;
  int offset_local;
  int count_local;
  unsigned_long_long *err_local;
  unsigned_long_long *ys_local;
  unsigned_long_long *xs_local;
  char *label_id_local;
  
  getter.Stride = offset;
  getter._44_4_ = count;
  GetterError<unsigned_long_long>::GetterError
            ((GetterError<unsigned_long_long> *)local_60,xs,ys,err,err,count,offset,stride);
  PlotErrorBarsEx<ImPlot::GetterError<unsigned_long_long>>
            (label_id,(GetterError<unsigned_long_long> *)local_60);
  return;
}

Assistant:

void PlotErrorBars(const char* label_id, const T* xs, const T* ys, const T* err, int count, int offset, int stride) {
    GetterError<T> getter(xs, ys, err, err, count, offset, stride);
    PlotErrorBarsEx(label_id, getter);
}